

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::_svector<xray_re::lw_vmref_entry,5u>,std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,5u>>>,write_vmref>
          (xr_writer *this,
          vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
          *container)

{
  bool bVar1;
  reference ref;
  __normal_iterator<const_xray_re::_svector<xray_re::lw_vmref_entry,_5U>_*,_std::vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>_>
  local_30;
  const_iterator end;
  const_iterator it;
  vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
  *container_local;
  xr_writer *this_local;
  
  end = std::
        vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
        ::begin(container);
  local_30._M_current =
       (_svector<xray_re::lw_vmref_entry,_5U> *)
       std::
       vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
       ::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar1) break;
    ref = __gnu_cxx::
          __normal_iterator<const_xray_re::_svector<xray_re::lw_vmref_entry,_5U>_*,_std::vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>_>
          ::operator*(&end);
    write_vmref::operator()((write_vmref *)((long)&this_local + 7),ref,this);
    __gnu_cxx::
    __normal_iterator<const_xray_re::_svector<xray_re::lw_vmref_entry,_5U>_*,_std::vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}